

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void check_op<std::not_equal_to>(void)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *__s;
  size_t __n;
  bool bVar6;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40;
  char *local_38;
  
  local_40 = 0;
  do {
    __s = (&PTR_anon_var_dwarf_2fe69_001d5940)[local_40];
    lVar4 = 0;
    local_38 = __s;
    do {
      sVar2 = strlen(__s);
      pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_2fe69_001d5940 + lVar4);
      sVar3 = strlen(pcVar5);
      __n = sVar3;
      if (sVar2 < sVar3) {
        __n = sVar2;
      }
      if (__n == 0) {
        local_60.ptr_._0_1_ = sVar2 != sVar3;
        bVar6 = false;
      }
      else {
        iVar1 = bcmp(__s,pcVar5,__n);
        local_60.ptr_._0_1_ = sVar2 != sVar3 || iVar1 != 0;
        iVar1 = bcmp(__s,pcVar5,__n);
        bVar6 = iVar1 != 0;
      }
      local_58.data_._0_1_ = sVar2 != sVar3 | bVar6;
      testing::internal::CmpHelperEQ<bool,bool>
                (local_50,"Op<int>()(lhs.compare(rhs), 0)","Op<string_view>()(lhs, rhs)",
                 (bool *)&local_60,(bool *)&local_58);
      __s = local_38;
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar5 = "";
        if (local_48.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                   ,0x1aa,pcVar5);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar6 = testing::internal::IsTrue(true);
          if ((bVar6) &&
             (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60.ptr_ + 8))();
          }
          local_60.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    local_40 = local_40 + 1;
  } while (local_40 != 3);
  return;
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}